

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O1

void __thiscall
BRTS_XZ<RemSP>::FindRunsMem
          (BRTS_XZ<RemSP> *this,uint64_t *bits_start,int height,int data_width,Run *runs)

{
  ulong *puVar1;
  ushort uVar2;
  uint uVar3;
  pointer puVar4;
  pointer piVar5;
  Run *pRVar6;
  short sVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong *puVar12;
  long lVar13;
  Run *pRVar14;
  long lVar15;
  ulong *puVar16;
  Run *pRVar17;
  unsigned_short uVar18;
  short sVar19;
  uint64_t *puVar20;
  ulong uVar21;
  uint64_t uVar22;
  unsigned_short uVar23;
  long lVar24;
  Run *pRVar25;
  ulong uVar26;
  Run *local_88;
  
  piVar5 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)data_width;
  uVar22 = *bits_start;
  sVar19 = 0;
  puVar20 = bits_start;
  local_88 = runs;
  do {
    lVar11 = 0;
    if (uVar22 != 0) {
      for (; (uVar22 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
      }
    }
    sVar7 = (short)lVar11;
    if (uVar22 == 0) {
      do {
        puVar20 = puVar20 + 1;
        if (puVar20 == bits_start + lVar10) {
          local_88->start_pos = 0xffff;
          local_88->end_pos = 0xffff;
          if (height < 2) {
LAB_00228751:
            uVar9 = RemSP::MemFlatten();
            (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
            return;
          }
          uVar21 = 1;
LAB_00228577:
          pRVar14 = local_88 + 1;
          puVar16 = bits_start + uVar21 * lVar10;
          puVar12 = puVar16 + lVar10;
          uVar26 = *puVar16;
          lVar11 = 0;
          local_88 = pRVar14;
          do {
            lVar13 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
              }
            }
            lVar15 = lVar11;
            if (uVar26 == 0) {
              do {
                puVar16 = puVar16 + 1;
                if (puVar16 == puVar12) {
                  local_88->start_pos = 0xffff;
                  local_88->end_pos = 0xffff;
                  uVar21 = uVar21 + 1;
                  runs = pRVar14;
                  if (uVar21 != (uint)height) goto LAB_00228577;
                  goto LAB_00228751;
                }
                lVar15 = lVar11 + 0x40;
                uVar26 = *puVar16;
                lVar13 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                  }
                }
                lVar11 = lVar15;
              } while (uVar26 == 0);
            }
            uVar26 = (~uVar26 >> ((byte)lVar13 & 0x3f)) << ((byte)lVar13 & 0x3f);
            lVar24 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
              }
            }
            lVar11 = lVar15;
            if (uVar26 == 0) {
              do {
                lVar11 = lVar11 + 0x40;
                puVar1 = puVar16 + 1;
                puVar16 = puVar16 + 1;
                uVar26 = ~*puVar1;
                lVar24 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                  }
                }
              } while (*puVar1 == 0xffffffffffffffff);
            }
            uVar23 = (unsigned_short)(lVar13 + lVar15);
            pRVar6 = runs + -1;
            pRVar17 = runs;
            do {
              pRVar25 = pRVar6;
              pRVar17 = pRVar17 + 1;
              uVar2 = pRVar25[1].end_pos;
              runs = pRVar25 + 1;
              pRVar6 = runs;
            } while ((uint)uVar2 < ((uint)(lVar13 + lVar15) & 0xffff));
            uVar18 = (unsigned_short)(lVar11 + lVar24);
            uVar9 = (uint)(lVar11 + lVar24) & 0xffff;
            if (uVar9 < runs->start_pos) {
              local_88->start_pos = uVar23;
              local_88->end_pos = uVar18;
              uVar9 = RemSP::length_;
              lVar13 = (long)(int)RemSP::length_;
              RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13] =
                   RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar13] + 1;
              RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar13] = uVar9;
              uVar8 = RemSP::length_;
              RemSP::length_ = RemSP::length_ + 1;
            }
            else {
              uVar8 = pRVar25[1].label;
              RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar8] =
                   RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar8] + 1;
              uVar8 = RemSP::mem_P_.vec_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)uVar8];
              for (; (uVar2 < uVar9 && (runs = pRVar17, pRVar17->start_pos <= uVar9));
                  pRVar17 = pRVar17 + 1) {
                uVar3 = pRVar17->label;
                RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)uVar3] =
                     RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar3] + 1;
                if (uVar8 != RemSP::mem_P_.vec_.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[(int)uVar3]) {
                  uVar8 = RemSP::MemMerge(uVar8,RemSP::mem_P_.vec_.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start
                                                [(int)uVar3]);
                }
                uVar2 = pRVar17->end_pos;
              }
              local_88->start_pos = uVar23;
              local_88->end_pos = uVar18;
            }
            uVar26 = ~uVar26 & -1L << ((byte)lVar24 & 0x3f);
            local_88->label = uVar8;
            local_88 = local_88 + 1;
          } while( true );
        }
        sVar19 = sVar19 + 0x40;
        uVar22 = *puVar20;
        lVar11 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
          }
        }
        sVar7 = (short)lVar11;
      } while (uVar22 == 0);
    }
    uVar21 = (~uVar22 >> ((byte)sVar7 & 0x3f)) << ((byte)sVar7 & 0x3f);
    local_88->start_pos = sVar7 + sVar19;
    lVar11 = 0;
    if (uVar21 != 0) {
      for (; (uVar21 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
      }
    }
    sVar7 = (short)lVar11;
    if (uVar21 == 0) {
      do {
        sVar19 = sVar19 + 0x40;
        puVar16 = puVar20 + 1;
        puVar20 = puVar20 + 1;
        uVar21 = ~*puVar16;
        lVar11 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
          }
        }
        sVar7 = (short)lVar11;
      } while (*puVar16 == 0xffffffffffffffff);
    }
    uVar22 = (~uVar21 >> ((byte)sVar7 & 0x3f)) << ((byte)sVar7 & 0x3f);
    local_88->end_pos = sVar7 + sVar19;
    uVar9 = RemSP::length_;
    lVar11 = (long)(int)RemSP::length_;
    piVar5[lVar11] = piVar5[lVar11] + 1;
    puVar4[lVar11] = uVar9;
    uVar9 = RemSP::length_ + 1;
    local_88->label = RemSP::length_;
    RemSP::length_ = uVar9;
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

void FindRunsMem(const uint64_t* bits_start, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::MemNewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;
            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this run starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::MemNewLabel();
                    continue;
                };

                unsigned label = LabelsSolver::MemGetLabel(runs_up->label);

                //Next upper run can not meet this
                if (end_pos <= runs_up->end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = label;
                    continue;
                }

                //Find next upper runs meet this
                runs_up++;
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                    if (label != label_other) label = LabelsSolver::MemMerge(label, label_other);
                    if (end_pos <= runs_up->end_pos) break;
                }
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
                runs->label = label;
            }

        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::MemFlatten();
    }